

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall CaDiCaL::Solver::limit(Solver *this,char *arg,int val)

{
  bool bVar1;
  State *pSVar2;
  undefined4 in_EDX;
  Internal *in_RSI;
  Solver *in_RDI;
  bool res;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((in_RDI->internal != (Internal *)0x0) && (in_RDI->trace_api_file != (FILE *)0x0)) {
    trace_api_call((Solver *)in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                   &in_RDI->adding_clause,in_stack_ffffffffffffffdc);
  }
  require_solver_pointer_to_be_non_zero
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (char *)0xe20de4);
  if (in_RDI->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::limit(const char *, int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RDI->internal == (Internal *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::limit(const char *, int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"internal solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar2 = state(in_RDI);
  if ((*pSVar2 & VALID) == 0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::limit(const char *, int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver in invalid state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  bVar1 = Internal::limit(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                          (int)((ulong)in_RDI >> 0x20));
  return bVar1;
}

Assistant:

bool Solver::limit (const char *arg, int val) {
  TRACE ("limit", arg, val);
  REQUIRE_VALID_STATE ();
  bool res = internal->limit (arg, val);
  LOG_API_CALL_END ("limit", arg, val, res);
  return res;
}